

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveReader::ReadCard16(CFFPrimitiveReader *this,unsigned_short *outValue)

{
  EStatusCode EVar1;
  byte local_22;
  byte local_21;
  Byte byte2;
  unsigned_short *puStack_20;
  Byte byte1;
  unsigned_short *outValue_local;
  CFFPrimitiveReader *this_local;
  
  puStack_20 = outValue;
  outValue_local = (unsigned_short *)this;
  EVar1 = ReadByte(this,&local_21);
  if (EVar1 == eSuccess) {
    EVar1 = ReadByte(this,&local_22);
    if (EVar1 == eSuccess) {
      *puStack_20 = (ushort)local_21 * 0x100 + (ushort)local_22;
      this_local._4_4_ = eSuccess;
    }
    else {
      this_local._4_4_ = eFailure;
    }
  }
  else {
    this_local._4_4_ = eFailure;
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadCard16(unsigned short& outValue)
{
	Byte byte1,byte2;

	if(ReadByte(byte1) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;

	if(ReadByte(byte2) != PDFHummus::eSuccess)
		return PDFHummus::eFailure;


	outValue = ((unsigned short)byte1 << 8) + byte2;

	return PDFHummus::eSuccess;

}